

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O3

void __thiscall
CumulativeCalProp::ttef_explanation_for_update_ub
          (CumulativeCalProp *this,int shift_in,int begin,int end,int task,int *bound,vec<Lit> *expl
          )

{
  int *piVar1;
  IntVar *pIVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  int en_lift;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> tasks_cp;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> tasks_tw;
  Lit local_7c;
  int local_78;
  int local_74;
  int *local_70;
  int local_64;
  _List_node_base local_60;
  undefined8 local_50;
  _List_node_base local_48;
  undefined8 local_38;
  
  iVar6 = (this->limit->max).v;
  piVar1 = this->workingPeriods[(long)this->resCalendar + -1];
  local_48._M_next = &local_48;
  local_38 = 0;
  local_60._M_next = &local_60;
  local_50 = 0;
  local_70 = bound;
  local_60._M_prev = local_60._M_next;
  local_48._M_prev = local_48._M_next;
  iVar5 = ttef_retrieve_tasks(this,shift_in,begin,end,task,
                              (list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
                               *)local_48._M_next,
                              (list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
                               *)local_60._M_next);
  if (this->rho == 1) {
    iVar7 = end - begin;
  }
  else {
    iVar7 = piVar1[begin] - piVar1[end];
  }
  iVar5 = iVar6 * iVar7 - iVar5;
  iVar6 = iVar5 / ((this->usage).data[(uint)task]->min).v;
  local_78 = ttef_get_new_end_time(this,begin,end,task,iVar6);
  if (this->ttef_expl_deg - ED_NORMAL < 2) {
    ttef_analyse_tasks_right_shift(this,begin,end,iVar6 + 1,task,0,&local_64);
  }
  iVar6 = this->lst_2[task];
  local_74 = ((this->usage).data[(uint)task]->min).v;
  local_74 = ~(iVar5 % local_74) + local_74;
  pIVar2 = (this->start).data[(uint)task];
  if (iVar6 < pIVar2->max0) {
    iVar5 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[3])(pIVar2);
    if (iVar5 == 3) {
      local_7c.x = (*(pIVar2->super_Var).super_Branching._vptr_Branching[9])(pIVar2);
    }
    else {
      local_7c.x = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xd])
                             (pIVar2,(long)iVar6 + 1,2);
    }
    vec<Lit>::push(expl,&local_7c);
  }
  pIVar2 = (this->dur).data[(uint)task];
  iVar6 = (pIVar2->min).v;
  if (pIVar2->min0 < iVar6) {
    iVar5 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[3])(pIVar2);
    if (iVar5 == 3) {
      local_7c.x = (*(pIVar2->super_Var).super_Branching._vptr_Branching[8])(pIVar2);
    }
    else {
      local_7c.x = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xd])
                             (pIVar2,(long)iVar6 + -1,3);
    }
    vec<Lit>::push(expl,&local_7c);
  }
  pIVar2 = (this->usage).data[(uint)task];
  iVar6 = (pIVar2->min).v;
  if (pIVar2->min0 < iVar6) {
    iVar5 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[3])(pIVar2);
    if (iVar5 == 3) {
      local_7c.x = (*(pIVar2->super_Var).super_Branching._vptr_Branching[8])(pIVar2);
    }
    else {
      local_7c.x = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xd])
                             (pIVar2,(long)iVar6 + -1,3);
    }
    vec<Lit>::push(expl,&local_7c);
  }
  ttef_analyse_limit_and_tasks
            (this,begin,end,end - (iVar7 + begin),
             (list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *)
             &local_48,
             (list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *)
             &local_60,&local_74,expl);
  *local_70 = local_78;
  p_Var4 = local_60._M_next;
  while (p_Var3 = local_48._M_next, p_Var4 != &local_60) {
    p_Var3 = (((_List_base<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var3;
  }
  while (p_Var3 != &local_48) {
    p_Var4 = (((_List_base<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var4;
  }
  return;
}

Assistant:

void CumulativeCalProp::ttef_explanation_for_update_ub(int shift_in, const int begin, const int end,
																											 const int task, int& bound, vec<Lit>& expl) {
	// Some constants
	const int maxLimit = max_limit();
	const int* rPeriods = workingPeriods[resCalendar - 1];
	const int* wPeriods = workingPeriods[taskCalendar[task] - 1];

	// Some variables
	std::list<TaskDur> tasks_tw;
	std::list<TaskDur> tasks_cp;

	// Retrieving tasks involved in the time interval [begin, end) excluding task 'task'
	const int en_req = ttef_retrieve_tasks(shift_in, begin, end, task, tasks_tw, tasks_cp);

	// Calculating the available energy in the time interval [begin, end)
	const int wdays = (rho == 1 ? end - begin : rPeriods[begin] - rPeriods[end]);
	const int en_avail = maxLimit * wdays - en_req;
	const int breaks = end - begin - wdays;

	// Calculating the working days available for the task 'task' in the considered time interval
	const int wdays_avail = en_avail / min_usage(task);
	const int min_wdays_in = wdays_avail + 1;

	// Determining the new upper bound on the latest completion time
	const int new_lct = ttef_get_new_end_time(begin, end, task, wdays_avail);

	// Some consistency checks
	assert(new_lct <= bound);
	assert(rho == 0 ||
				 en_avail < min_usage(task) * (std::min(end, lct_2[task]) - std::max(begin, lst_2[task])));
	assert(rho == 1 || en_avail < min_usage(task) * (wPeriods[std::max(begin, lst_2[task])] -
																									 wPeriods[std::min(end, lct_2[task])]));

	// Calculating the explanation lower bound on the start time
	int expl_wdays_in;
	int expl_ub;
	switch (ttef_expl_deg) {
		case ED_NORMAL:
		case ED_LIFT:
			expl_ub = ttef_analyse_tasks_right_shift(begin, end, min_wdays_in, task, 0, expl_wdays_in);
		case ED_NAIVE:
		default:
			expl_ub = lst_2[task];
			const int expl_begin = std::max(begin, expl_ub);
			const int expl_end = std::min(end, lct_2[task]);
			expl_wdays_in =
					(rho == 1 ? expl_end - expl_begin : wPeriods[expl_begin] - wPeriods[expl_end]);
	}

	// Calculating the lifting energy for the remainder
	int en_lift = min_usage(task) - 1 - (en_avail % min_usage(task));

	// More consistency checks
	assert(expl_ub >= lst_2[task]);
	assert(expl_wdays_in >= wdays_avail + 1);
	assert(en_lift >= 0);

	// Explaining the update for task 'task'
	if (expl_ub < max_start0(task)) {
		// start[task] <= expl_ub
		expl.push(getNegLeqLit(start[task], expl_ub));
	}
	// Get the negated literal for [[dur[task] >= min_dur(task)]]
	if (min_dur0(task) < min_dur(task)) {
		expl.push(getNegGeqLit(dur[task], min_dur(task)));
	}
	// Get the negated literal for [[usage[task] >= min_usage(task)]]
	if (min_usage0(task) < min_usage(task)) {
		expl.push(getNegGeqLit(usage[task], min_usage(task)));
	}

	// Retrieve explanation for the remaining tasks
	ttef_analyse_limit_and_tasks(begin, end, breaks, tasks_tw, tasks_cp, en_lift, expl);

	// Assigning new lower bound
	bound = new_lct;
}